

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5VocabInitVtab(sqlite3 *db,void *pAux,int argc,char **argv,sqlite3_vtab **ppVTab,char **pzErr
                     )

{
  int *__s;
  char *pIn;
  int iVar1;
  uint uVar2;
  size_t sVar3;
  char *pcVar4;
  size_t sVar5;
  byte *z;
  sqlite3_vtab *psVar6;
  void *__dest;
  long lVar7;
  bool bVar8;
  int rc;
  int rc_1;
  int local_60;
  int local_5c;
  sqlite3 *local_58;
  char *local_50;
  char *local_48;
  sqlite3_vtab **local_40;
  sqlite3_module *local_38;
  
  local_60 = 0;
  local_38 = (sqlite3_module *)pAux;
  if (argc == 6) {
    __s = (int *)argv[1];
    sVar3 = strlen((char *)__s);
    if (sVar3 == 4) {
      bVar8 = *__s == 0x706d6574;
      goto LAB_001b2f24;
    }
  }
  bVar8 = false;
LAB_001b2f24:
  if ((argc == 5) || (bVar8 != false)) {
    pcVar4 = argv[(ulong)bVar8 + 3];
    pIn = argv[(ulong)bVar8 + 4];
    local_48 = argv[(ulong)bVar8 * 2 + 1];
    local_58 = db;
    local_40 = ppVTab;
    sVar3 = strlen(local_48);
    local_50 = pcVar4;
    sVar5 = strlen(pcVar4);
    local_5c = 0;
    z = (byte *)sqlite3Fts5Strndup(&local_5c,pIn,-1);
    lVar7 = 0;
    if (local_5c == 0) {
      if ((*z - 0x22 < 0x3f) && ((0x4200000000000021U >> ((ulong)(*z - 0x22) & 0x3f) & 1) != 0)) {
        fts5Dequote((char *)z);
      }
      iVar1 = sqlite3StrICmp((char *)z,"col");
      if (iVar1 == 0) {
        lVar7 = 0;
      }
      else {
        iVar1 = sqlite3StrICmp((char *)z,"row");
        if (iVar1 == 0) {
          lVar7 = 1;
        }
        else {
          iVar1 = sqlite3StrICmp((char *)z,"instance");
          if (iVar1 == 0) {
            lVar7 = 2;
          }
          else {
            lVar7 = 0;
            pcVar4 = sqlite3_mprintf("fts5vocab: unknown table type: %Q",z);
            *pzErr = pcVar4;
            local_5c = 1;
          }
        }
      }
      sqlite3_free(z);
    }
    local_60 = local_5c;
    if (local_5c == 0) {
      local_60 = sqlite3_declare_vtab
                           (local_58,(char *)((long)&DAT_001de380 +
                                             (long)(int)(&DAT_001de380)[lVar7]));
    }
    psVar6 = (sqlite3_vtab *)sqlite3Fts5MallocZero(&local_60,(long)((int)sVar3 + (int)sVar5 + 0x42))
    ;
    ppVTab = local_40;
    if (psVar6 != (sqlite3_vtab *)0x0) {
      sVar5 = (size_t)((int)sVar5 + 1);
      psVar6[2].pModule = local_38;
      psVar6[2].nRef = (int)lVar7;
      psVar6[1].zErrMsg = (char *)local_58;
      psVar6[1].pModule = (sqlite3_module *)&psVar6[2].zErrMsg;
      __dest = (void *)((long)&psVar6[2].zErrMsg + sVar5);
      *(void **)&psVar6[1].nRef = __dest;
      memcpy(&psVar6[2].zErrMsg,local_50,sVar5);
      memcpy(__dest,local_48,(long)((int)sVar3 + 1));
      uVar2 = (byte)(psVar6[1].pModule)->iVersion - 0x22;
      if ((uVar2 < 0x3f) && ((0x4200000000000021U >> ((ulong)uVar2 & 0x3f) & 1) != 0)) {
        fts5Dequote((char *)psVar6[1].pModule);
      }
      uVar2 = **(byte **)&psVar6[1].nRef - 0x22;
      if ((uVar2 < 0x3f) && ((0x4200000000000021U >> ((ulong)uVar2 & 0x3f) & 1) != 0)) {
        fts5Dequote((char *)*(byte **)&psVar6[1].nRef);
      }
    }
  }
  else {
    psVar6 = (sqlite3_vtab *)0x0;
    pcVar4 = sqlite3_mprintf("wrong number of vtable arguments");
    *pzErr = pcVar4;
    local_60 = 1;
  }
  *ppVTab = psVar6;
  return local_60;
}

Assistant:

static int fts5VocabInitVtab(
  sqlite3 *db,                    /* The SQLite database connection */
  void *pAux,                     /* Pointer to Fts5Global object */
  int argc,                       /* Number of elements in argv array */
  const char * const *argv,       /* xCreate/xConnect argument array */
  sqlite3_vtab **ppVTab,          /* Write the resulting vtab structure here */
  char **pzErr                    /* Write any error message here */
){
  const char *azSchema[] = { 
    "CREATE TABlE vocab(" FTS5_VOCAB_COL_SCHEMA  ")", 
    "CREATE TABlE vocab(" FTS5_VOCAB_ROW_SCHEMA  ")",
    "CREATE TABlE vocab(" FTS5_VOCAB_INST_SCHEMA ")"
  };

  Fts5VocabTable *pRet = 0;
  int rc = SQLITE_OK;             /* Return code */
  int bDb;

  bDb = (argc==6 && strlen(argv[1])==4 && memcmp("temp", argv[1], 4)==0);

  if( argc!=5 && bDb==0 ){
    *pzErr = sqlite3_mprintf("wrong number of vtable arguments");
    rc = SQLITE_ERROR;
  }else{
    int nByte;                      /* Bytes of space to allocate */
    const char *zDb = bDb ? argv[3] : argv[1];
    const char *zTab = bDb ? argv[4] : argv[3];
    const char *zType = bDb ? argv[5] : argv[4];
    int nDb = (int)strlen(zDb)+1; 
    int nTab = (int)strlen(zTab)+1;
    int eType = 0;
    
    rc = fts5VocabTableType(zType, pzErr, &eType);
    if( rc==SQLITE_OK ){
      assert( eType>=0 && eType<ArraySize(azSchema) );
      rc = sqlite3_declare_vtab(db, azSchema[eType]);
    }

    nByte = sizeof(Fts5VocabTable) + nDb + nTab;
    pRet = sqlite3Fts5MallocZero(&rc, nByte);
    if( pRet ){
      pRet->pGlobal = (Fts5Global*)pAux;
      pRet->eType = eType;
      pRet->db = db;
      pRet->zFts5Tbl = (char*)&pRet[1];
      pRet->zFts5Db = &pRet->zFts5Tbl[nTab];
      memcpy(pRet->zFts5Tbl, zTab, nTab);
      memcpy(pRet->zFts5Db, zDb, nDb);
      sqlite3Fts5Dequote(pRet->zFts5Tbl);
      sqlite3Fts5Dequote(pRet->zFts5Db);
    }
  }

  *ppVTab = (sqlite3_vtab*)pRet;
  return rc;
}